

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

size_t qHash<QFont::Tag>(QList<QFont::Tag> *key,size_t seed)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar1 = (key->d).size;
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)&((key->d).ptr)->m_value + lVar2) * -0x2917014799a6026d;
      uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
      seed = seed ^ (seed >> 2) + seed * 0x40 + 0x9e3779b9 + (uVar3 >> 0x20 ^ uVar3);
      lVar2 = lVar2 + 4;
    } while (lVar1 << 2 != lVar2);
  }
  return seed;
}

Assistant:

size_t qHash(const QList<T> &key, size_t seed = 0)
    noexcept(noexcept(qHashRange(key.cbegin(), key.cend(), seed)))
{
    return qHashRange(key.cbegin(), key.cend(), seed);
}